

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O3

size_t revealSeedsSize(uint numNodes,uint16_t *hideList,size_t hideListSize,
                      picnic_instance_t *params)

{
  _Bool _Var1;
  uint *__ptr;
  size_t numNodesRevealed;
  tree_t tree;
  size_t local_50;
  tree_t local_48;
  
  _Var1 = createTree(&local_48,numNodes,0);
  local_50 = 0xffffffffffffffff;
  if (_Var1) {
    local_50 = 0;
    __ptr = getRevealedNodes(&local_48,hideList,hideListSize,&local_50);
    free(local_48.haveNodeExists);
    free(local_48.nodes);
    free(__ptr);
    local_50 = params->seed_size * local_50;
  }
  return local_50;
}

Assistant:

size_t revealSeedsSize(unsigned int numNodes, uint16_t* hideList, size_t hideListSize,
                       const picnic_instance_t* params) {
  tree_t tree;
  if (!createTree(&tree, numNodes, 0)) {
    return SIZE_MAX;
  }

  size_t numNodesRevealed = 0;
  unsigned int* revealed  = getRevealedNodes(&tree, hideList, hideListSize, &numNodesRevealed);
  clearTree(&tree);
  free(revealed);
  return numNodesRevealed * params->seed_size;
}